

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

string * __thiscall
(anonymous_namespace)::DescriptorChecksum_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Span<const_char> *span)

{
  long lVar1;
  bool bVar2;
  _Alloc_hider _Var3;
  int j;
  void *pvVar4;
  long lVar5;
  long lVar6;
  char *__end;
  int iVar7;
  long lVar8;
  ulong uVar9;
  uint64_t c;
  int iVar10;
  long in_FS_OFFSET;
  bool bVar11;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (DescriptorChecksum[abi:cxx11](Span<char_const>const&)::INPUT_CHARSET_abi_cxx11_ == '\0') {
    iVar10 = __cxa_guard_acquire(&DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                                  INPUT_CHARSET_abi_cxx11_);
    if (iVar10 != 0) {
      DescriptorChecksum[abi:cxx11](Span<char_const>const&)::INPUT_CHARSET_abi_cxx11_._M_dataplus.
      _M_p = (pointer)&DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                       INPUT_CHARSET_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &DescriptorChecksum[abi:cxx11](Span<char_const>const&)::INPUT_CHARSET_abi_cxx11_,
                 "0123456789()[],\'/*abcdefgh@:$%{}IJKLMNOPQRSTUVWXYZ&+-.;<=>?!^_|~ijklmnopqrstuvwxyzABCDEFGH`#\"\\ "
                 ,"");
      __cxa_atexit(std::__cxx11::string::~string,
                   &DescriptorChecksum[abi:cxx11](Span<char_const>const&)::INPUT_CHARSET_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                           INPUT_CHARSET_abi_cxx11_);
    }
  }
  if (DescriptorChecksum[abi:cxx11](Span<char_const>const&)::CHECKSUM_CHARSET_abi_cxx11_ == '\0') {
    iVar10 = __cxa_guard_acquire(&DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                                  CHECKSUM_CHARSET_abi_cxx11_);
    if (iVar10 != 0) {
      DescriptorChecksum[abi:cxx11](Span<char_const>const&)::CHECKSUM_CHARSET_abi_cxx11_._M_dataplus
      ._M_p = (pointer)&DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                        CHECKSUM_CHARSET_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &DescriptorChecksum[abi:cxx11](Span<char_const>const&)::CHECKSUM_CHARSET_abi_cxx11_
                 ,"qpzry9x8gf2tvdw0s3jn54khce6mua7l","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                    CHECKSUM_CHARSET_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                           CHECKSUM_CHARSET_abi_cxx11_);
    }
  }
  lVar5 = *(long *)(this + 8);
  bVar11 = lVar5 == 0;
  if (bVar11) {
    bVar2 = false;
    c = 1;
    iVar10 = 0;
  }
  else {
    lVar6 = *(long *)this;
    lVar8 = 0;
    c = 1;
    iVar10 = 0;
    iVar7 = 0;
    do {
      _Var3._M_p = DescriptorChecksum[abi:cxx11](Span<char_const>const&)::INPUT_CHARSET_abi_cxx11_.
                   _M_dataplus._M_p;
      if (DescriptorChecksum[abi:cxx11](Span<char_const>const&)::INPUT_CHARSET_abi_cxx11_.
          _M_string_length == 0) {
        uVar9 = 0xffffffffffffffff;
      }
      else {
        pvVar4 = memchr(DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                        INPUT_CHARSET_abi_cxx11_._M_dataplus._M_p,(int)*(char *)(lVar6 + lVar8),
                        DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                        INPUT_CHARSET_abi_cxx11_._M_string_length);
        uVar9 = -(ulong)(pvVar4 == (void *)0x0) | (long)pvVar4 - (long)_Var3._M_p;
      }
      if (uVar9 == 0xffffffffffffffff) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>();
      }
      else {
        c = anon_unknown.dwarf_147e942::PolyMod(c,(uint)uVar9 & 0x1f);
        iVar10 = (int)(uVar9 >> 5) + iVar10 * 3;
        iVar7 = iVar7 + 1;
        if (iVar7 == 3) {
          c = anon_unknown.dwarf_147e942::PolyMod(c,iVar10);
          iVar7 = 0;
          iVar10 = 0;
        }
      }
      if (uVar9 == 0xffffffffffffffff) break;
      lVar8 = lVar8 + 1;
      bVar11 = lVar5 == lVar8;
    } while (!bVar11);
    bVar2 = 0 < iVar7;
  }
  if (bVar11) {
    if (bVar2) {
      c = anon_unknown.dwarf_147e942::PolyMod(c,iVar10);
    }
    iVar10 = 8;
    do {
      c = anon_unknown.dwarf_147e942::PolyMod(c,0);
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = 0x2020202020202020;
    __return_storage_ptr__->_M_string_length = 8;
    (__return_storage_ptr__->field_2)._M_local_buf[8] = '\0';
    lVar6 = 0x23;
    lVar5 = 0;
    do {
      (__return_storage_ptr__->_M_dataplus)._M_p[lVar5] =
           DescriptorChecksum[abi:cxx11](Span<char_const>const&)::CHECKSUM_CHARSET_abi_cxx11_.
           _M_dataplus._M_p[(uint)((c ^ 1) >> ((byte)lVar6 & 0x3f)) & 0x1f];
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + -5;
    } while (lVar6 != -5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string DescriptorChecksum(const Span<const char>& span)
{
    /** A character set designed such that:
     *  - The most common 'unprotected' descriptor characters (hex, keypaths) are in the first group of 32.
     *  - Case errors cause an offset that's a multiple of 32.
     *  - As many alphabetic characters are in the same group (while following the above restrictions).
     *
     * If p(x) gives the position of a character c in this character set, every group of 3 characters
     * (a,b,c) is encoded as the 4 symbols (p(a) & 31, p(b) & 31, p(c) & 31, (p(a) / 32) + 3 * (p(b) / 32) + 9 * (p(c) / 32).
     * This means that changes that only affect the lower 5 bits of the position, or only the higher 2 bits, will just
     * affect a single symbol.
     *
     * As a result, within-group-of-32 errors count as 1 symbol, as do cross-group errors that don't affect
     * the position within the groups.
     */
    static const std::string INPUT_CHARSET =
        "0123456789()[],'/*abcdefgh@:$%{}"
        "IJKLMNOPQRSTUVWXYZ&+-.;<=>?!^_|~"
        "ijklmnopqrstuvwxyzABCDEFGH`#\"\\ ";

    /** The character set for the checksum itself (same as bech32). */
    static const std::string CHECKSUM_CHARSET = "qpzry9x8gf2tvdw0s3jn54khce6mua7l";

    uint64_t c = 1;
    int cls = 0;
    int clscount = 0;
    for (auto ch : span) {
        auto pos = INPUT_CHARSET.find(ch);
        if (pos == std::string::npos) return "";
        c = PolyMod(c, pos & 31); // Emit a symbol for the position inside the group, for every character.
        cls = cls * 3 + (pos >> 5); // Accumulate the group numbers
        if (++clscount == 3) {
            // Emit an extra symbol representing the group numbers, for every 3 characters.
            c = PolyMod(c, cls);
            cls = 0;
            clscount = 0;
        }
    }
    if (clscount > 0) c = PolyMod(c, cls);
    for (int j = 0; j < 8; ++j) c = PolyMod(c, 0); // Shift further to determine the checksum.
    c ^= 1; // Prevent appending zeroes from not affecting the checksum.

    std::string ret(8, ' ');
    for (int j = 0; j < 8; ++j) ret[j] = CHECKSUM_CHARSET[(c >> (5 * (7 - j))) & 31];
    return ret;
}